

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O0

void * coll_seq_remove_first(coll_seq_t *seq)

{
  coll_seq_node_t *pcVar1;
  node_t_conflict *next;
  void *data;
  coll_seq_t *seq_local;
  
  if ((seq == (coll_seq_t *)0x0) || (seq->len == 0)) {
    seq_local = (coll_seq_t *)0x0;
  }
  else {
    seq_local = (coll_seq_t *)seq->head->data;
    pcVar1 = seq->head->next;
    free(seq->head);
    seq->head = pcVar1;
    seq->len = seq->len - 1;
  }
  return seq_local;
}

Assistant:

void *coll_seq_remove_first(coll_seq_t *seq) {
    if (!seq || seq->len == 0) {
        return NULL;
    }
    void *data = seq->head->data;
    node_t *next = seq->head->next;
    free(seq->head);
    seq->head = next;
    --(seq->len);
    return data;
}